

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int is_stateless_reset(quicly_conn_t *conn,quicly_decoded_packet_t *decoded)

{
  ulong uVar1;
  anon_enum_32 aVar2;
  
  aVar2 = decoded->_is_stateless_reset_cached;
  if (aVar2 != QUICLY__DECODED_PACKET_CACHED_IS_STATELESS_RESET) {
    if (aVar2 == QUICLY__DECODED_PACKET_CACHED_NOT_STATELESS_RESET) {
      return 0;
    }
    aVar2 = QUICLY__DECODED_PACKET_CACHED_MAYBE_STATELESS_RESET;
    if (((conn->super).remote.cid_set.cids[0].is_active != 0) &&
       (uVar1 = (decoded->octets).len, 0x26 < uVar1)) {
      return (int)(*(undefined1 (*) [16])((decoded->octets).base + (uVar1 - 0x10)) ==
                  *(undefined1 (*) [16])(conn->super).remote.cid_set.cids[0].stateless_reset_token);
    }
  }
  return aVar2;
}

Assistant:

static int is_stateless_reset(quicly_conn_t *conn, quicly_decoded_packet_t *decoded)
{
    switch (decoded->_is_stateless_reset_cached) {
    case QUICLY__DECODED_PACKET_CACHED_IS_STATELESS_RESET:
        return 1;
    case QUICLY__DECODED_PACKET_CACHED_NOT_STATELESS_RESET:
        return 0;
    default:
        break;
    }

    if (!conn->super.remote.cid_set.cids[0].is_active)
        return 0;
    if (decoded->octets.len < QUICLY_STATELESS_RESET_PACKET_MIN_LEN)
        return 0;
    if (memcmp(decoded->octets.base + decoded->octets.len - QUICLY_STATELESS_RESET_TOKEN_LEN,
               conn->super.remote.cid_set.cids[0].stateless_reset_token, QUICLY_STATELESS_RESET_TOKEN_LEN) != 0)
        return 0;

    return 1;
}